

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Node * __thiscall rw::ColorQuant::createNode(ColorQuant *this,int32 level)

{
  Node *pNVar1;
  EVP_PKEY_CTX *ctx;
  Node *node;
  int i;
  int32 level_local;
  ColorQuant *this_local;
  
  ctx = (EVP_PKEY_CTX *)0x30018;
  pNVar1 = (Node *)mustmalloc_LOC(0xb0,0x30018,
                                  "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 1117"
                                 );
  pNVar1->parent = (Node *)0x0;
  for (node._0_4_ = 0; (int)node < 0x10; node._0_4_ = (int)node + 1) {
    pNVar1->children[(int)node] = (Node *)0x0;
  }
  pNVar1->r = 0;
  pNVar1->g = 0;
  pNVar1->b = 0;
  pNVar1->a = 0;
  pNVar1->numPixels = 0;
  LLLink::init(&pNVar1->link,ctx);
  if (level == 0) {
    LinkList::append(&this->leaves,&pNVar1->link);
  }
  return pNVar1;
}

Assistant:

ColorQuant::Node*
ColorQuant::createNode(int32 level)
{
	int i;
	ColorQuant::Node *node = rwNewT(ColorQuant::Node, 1, MEMDUR_EVENT | ID_IMAGE);
	node->parent = nil;
	for(i = 0; i < 16; i++)
		node->children[i] = nil;
	node->r = 0;
	node->g = 0;
	node->b = 0;
	node->a = 0;
	node->numPixels = 0;
	node->link.init();

	if(level == 0)
		this->leaves.append(&node->link);

	return node;
}